

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_section_fixups.cpp
# Opt level: O0

void __thiscall
ExchangeSectionFixups_RoundTripInternalCollection_Test::
~ExchangeSectionFixups_RoundTripInternalCollection_Test
          (ExchangeSectionFixups_RoundTripInternalCollection_Test *this)

{
  ExchangeSectionFixups_RoundTripInternalCollection_Test *this_local;
  
  ~ExchangeSectionFixups_RoundTripInternalCollection_Test(this);
  operator_delete(this,0x150);
  return;
}

Assistant:

TEST_F (ExchangeSectionFixups, RoundTripInternalCollection) {
    // Start with a small collection of internal fixups.
    internal_fixup_collection ifixups;
    ifixups.emplace_back (pstore::repo::section_kind::text, pstore::repo::relocation_type{17},
                          std::uint64_t{19} /*offset */, std::int64_t{23} /*addend*/);
    ifixups.emplace_back (pstore::repo::section_kind::text, pstore::repo::relocation_type{29},
                          std::uint64_t{31} /*offset */, std::int64_t{37} /*addend*/);
    ifixups.emplace_back (pstore::repo::section_kind::thread_data,
                          pstore::repo::relocation_type{41}, std::uint64_t{43} /*offset */,
                          std::int64_t{47} /*addend*/);

    // Export the internal fixup array to the 'os' string-stream.
    pstore::exchange::export_ns::ostringstream os;
    emit_internal_fixups (os, pstore::exchange::export_ns::indent{}, std::begin (ifixups),
                          std::end (ifixups));

    // Setup the parse.
    pstore::exchange::import_ns::string_mapping imported_names;
    internal_fixup_collection imported_ifixups;
    auto parser = pstore::json::make_parser (
        pstore::exchange::import_ns::callbacks::make<internal_fixup_array_root> (
            &db_, &imported_names, &imported_ifixups));

    // Import the data that we just exported.
    parser.input (os.str ());
    parser.eof ();

    // Check that we got back what we started with.
    ASSERT_FALSE (parser.has_error ()) << "JSON error was: " << parser.last_error ().message ();
    EXPECT_THAT (imported_ifixups, testing::ContainerEq (ifixups))
        << "The imported and exported ifixups should match";
}